

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O3

int Pla_ManHashDistance1(Pla_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Tab_Man_t *pTab;
  Tab_Obj_t *pTVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  iVar1 = p->nIns;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar5;
  uVar12 = (p->vCubes).nSize;
  uVar10 = 0x1f;
  if (uVar12 - 1 != 0) {
    for (; uVar12 - 1 >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar10 = (uVar10 ^ 0xffffffe0) + 0x21;
  if (uVar12 < 2) {
    uVar10 = uVar12;
  }
  if (0x18 < (int)uVar10) {
    __assert_fail("nBits <= 26",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                  ,0xb9,"int Pla_ManHashDistance1(Pla_Man_t *)");
  }
  pTab = (Tab_Man_t *)calloc(1,0x18);
  if ((int)uVar10 < 2) {
    __assert_fail("LogSize >= 4 && LogSize <= 26",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                  ,0x6e,"Tab_Man_t *Tab_ManAlloc(int, Pla_Man_t *)");
  }
  uVar12 = 4 << ((byte)uVar10 & 0x1f);
  pTab->SizeMask = uVar12 - 1;
  pTVar6 = (Tab_Obj_t *)calloc((ulong)uVar12,0x10);
  pTab->pBins = pTVar6;
  pTab->nBins = 1;
  pTab->pMan = p;
  Pla_ManConvertFromBits(p);
  Pla_ManHashCubes(p,pTab);
  if ((p->vCubeLits).nSize < 1) {
    uVar12 = 0;
  }
  else {
    lVar8 = 0;
    uVar12 = 0;
    do {
      pVVar4 = (p->vCubeLits).pArray;
      p_00->nSize = 0;
      if (0 < pVVar4[lVar8].nSize) {
        lVar9 = 0;
        do {
          Vec_IntPush(p_00,pVVar4[lVar8].pArray[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar4[lVar8].nSize);
      }
      if ((p->vHashes).nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p_00->nSize;
      lVar9 = (long)iVar1;
      if (0 < lVar9) {
        iVar7 = (p->vHashes).pArray[lVar8];
        piVar5 = p_00->pArray;
        lVar11 = 0;
        do {
          uVar10 = piVar5[lVar11];
          if ((int)uVar10 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10e,"int Abc_LitNot(int)");
          }
          if (0xff < uVar10) {
            __assert_fail("i >= 0 && i < PLA_HASH_VALUE_NUM",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                          ,0x42,"int Pla_HashValue(int)");
          }
          uVar14 = (ulong)uVar10 ^ 1;
          uVar2 = s_PlaHashValues[uVar14];
          uVar3 = s_PlaHashValues[uVar10];
          piVar5[lVar11] = (int)uVar14;
          pTVar6 = pTab->pBins;
          iVar13 = 0;
          if ((pTVar6 != (Tab_Obj_t *)0x0) &&
             (iVar15 = pTVar6[(int)(((uVar2 & 0x3ffffff) + iVar7) - (uVar3 & 0x3ffffff) &
                                   pTab->SizeMask)].Table, iVar15 != 0)) {
            do {
              lVar16 = (long)pTVar6[iVar15].Cube;
              if ((lVar16 < 0) || ((pTab->pMan->vCubeLits).nSize <= pTVar6[iVar15].Cube)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                              ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
              }
              pVVar4 = (pTab->pMan->vCubeLits).pArray;
              if (pVVar4[lVar16].nSize == iVar1) {
                lVar17 = 0;
                while (pVVar4[lVar16].pArray[lVar17] == piVar5[lVar17]) {
                  lVar17 = lVar17 + 1;
                  if (lVar9 == lVar17) {
                    iVar13 = 1;
                    goto LAB_00357af5;
                  }
                }
              }
              iVar15 = pTVar6[iVar15].Next;
            } while (iVar15 != 0);
          }
LAB_00357af5:
          uVar12 = uVar12 + iVar13;
          piVar5[lVar11] = uVar10;
          lVar11 = lVar11 + 1;
        } while (lVar11 != lVar9);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vCubeLits).nSize);
    piVar5 = p_00->pArray;
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(p_00);
  if (pTab->pBins != (Tab_Obj_t *)0x0) {
    free(pTab->pBins);
  }
  free(pTab);
  if ((uVar12 & 1) != 0) {
    __assert_fail("!(Count & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                  ,0xd1,"int Pla_ManHashDistance1(Pla_Man_t *)");
  }
  return (int)uVar12 >> 1;
}

Assistant:

int Pla_ManHashDistance1( Pla_Man_t * p )
{
    Tab_Man_t * pTab;
    Vec_Int_t * vCube;
    Vec_Int_t * vCubeCopy = Vec_IntAlloc( p->nIns );
    int nBits = Abc_Base2Log( Pla_ManCubeNum(p) ) + 2;
    int i, k, Lit, Value, ValueCopy, Count = 0;
    assert( nBits <= 26 );
    pTab = Tab_ManAlloc( nBits, p );
    Pla_ManConvertFromBits( p );
    Pla_ManHashCubes( p, pTab );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
    {
        Vec_IntClear( vCubeCopy );
        Vec_IntAppend( vCubeCopy, vCube );
        Value = ValueCopy = Vec_IntEntry( &p->vHashes, i );
        Vec_IntForEachEntry( vCubeCopy, Lit, k )
        {
            // create new
            Value += Pla_HashValue(Abc_LitNot(Lit)) - Pla_HashValue(Lit);
            Vec_IntWriteEntry( vCubeCopy, k, Abc_LitNot(Lit) );
            // check the cube
            Count += Tab_ManHashLookup( pTab, Value, vCubeCopy );
            // create old
            Value -= Pla_HashValue(Abc_LitNot(Lit)) - Pla_HashValue(Lit);
            Vec_IntWriteEntry( vCubeCopy, k, Lit );
        }
        assert( Value == ValueCopy );
    }
    Vec_IntFree( vCubeCopy );
    Tab_ManFree( pTab );
    assert( !(Count & 1) );
    return Count/2;
}